

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkAfterTrim(Aig_Man_t *pMan,Abc_Ntk_t *pNtkOld)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Abc_Ntk_t *pAVar12;
  int iVar13;
  long lVar14;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nBarBufs != 0) {
    __assert_fail("pNtkOld->nBarBufs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40b,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nObjCounts[8] < pMan->nRegs) {
    __assert_fail("Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40c,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->vCis->nSize < pMan->nTruePis) {
    __assert_fail("Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40d,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->nTruePos != pNtkOld->vPos->nSize) {
    __assert_fail("Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40e,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->vCiNumsOrig == (Vec_Int_t *)0x0) {
    __assert_fail("pMan->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40f,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  iVar13 = pMan->nBarBufs;
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = iVar13;
  pAVar4 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar4;
  uVar9 = pMan->nRegs;
  iVar13 = pMan->nObjs[2];
  if ((int)uVar9 < iVar13) {
    lVar14 = 0;
    do {
      if (pMan->vCis->nSize <= lVar14) goto LAB_0024a5ad;
      pvVar2 = pMan->vCis->pArray[lVar14];
      pAVar4 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
      if (pMan->vCiNumsOrig->nSize <= lVar14) goto LAB_0024a5cc;
      iVar13 = pMan->vCiNumsOrig->pArray[lVar14];
      if (((long)iVar13 < 0) || (pNtkOld->vCis->nSize <= iVar13)) goto LAB_0024a5ad;
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[iVar13]);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
      lVar14 = lVar14 + 1;
      uVar9 = pMan->nRegs;
      iVar13 = pMan->nObjs[2];
    } while (lVar14 < (int)(iVar13 - uVar9));
  }
  uVar6 = (ulong)uVar9;
  uVar10 = pMan->nObjs[3] - uVar9;
  uVar11 = (ulong)uVar10;
  if (uVar10 != 0 && (int)uVar9 <= pMan->nObjs[3]) {
    lVar14 = 0;
    do {
      if (pMan->vCos->nSize <= lVar14) goto LAB_0024a5ad;
      pvVar2 = pMan->vCos->pArray[lVar14];
      pAVar4 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
      if (pNtkOld->vCos->nSize <= lVar14) goto LAB_0024a5ad;
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCos->pArray[lVar14]);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
      lVar14 = lVar14 + 1;
      uVar6 = (ulong)pMan->nRegs;
      uVar11 = (long)pMan->nObjs[3] - uVar6;
    } while (lVar14 < (long)uVar11);
    iVar13 = pMan->nObjs[2];
  }
  if (pNtk->vCis->nSize != iVar13 - (int)uVar6) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x42a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vCos->nSize != (int)uVar11) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x42b,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (0 < (int)uVar6) {
    iVar13 = 0;
    do {
      uVar9 = (pMan->nObjs[3] - (int)uVar6) + iVar13;
      if (((((int)uVar9 < 0) || (pMan->vCos->nSize <= (int)uVar9)) ||
          (uVar10 = (pMan->nObjs[2] - (int)uVar6) + iVar13, (int)uVar10 < 0)) ||
         (pMan->vCis->nSize <= (int)uVar10)) goto LAB_0024a5ad;
      pvVar2 = pMan->vCos->pArray[uVar9];
      pvVar3 = pMan->vCis->pArray[uVar10];
      pAVar4 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar7;
      Abc_ObjAddFanin(pAVar4,*(Abc_Obj_t **)((long)pvVar2 + 0x28));
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar3 + 0x28),pAVar4);
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x1a3,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar4->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      uVar9 = pMan->nTruePis + iVar13;
      if (((int)uVar9 < 0) || (pMan->vCiNumsOrig->nSize <= (int)uVar9)) {
LAB_0024a5cc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pMan->vCiNumsOrig->pArray[uVar9];
      if (((long)iVar1 < 0) || (pNtkOld->vCis->nSize <= iVar1)) goto LAB_0024a5ad;
      pAVar4 = *(Abc_Obj_t **)((long)pvVar3 + 0x28);
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[iVar1]);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
      uVar9 = pMan->nTruePos + iVar13;
      if (((int)uVar9 < 0) || (pNtkOld->vCos->nSize <= (int)uVar9)) goto LAB_0024a5ad;
      pAVar4 = *(Abc_Obj_t **)((long)pvVar2 + 0x28);
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCos->pArray[uVar9]);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
      iVar13 = iVar13 + 1;
      uVar6 = (ulong)(uint)pMan->nRegs;
    } while (iVar13 < pMan->nRegs);
  }
  pVVar8 = Aig_ManDfs(pMan,1);
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar14];
      if ((*(uint *)((long)pvVar2 + 0x18) & 7) == 4) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_0024a5eb;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_0024a5eb;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar7 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar4,pAVar7);
      }
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  pVVar8 = pMan->vCos;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      if (((ulong)pVVar8->pArray[lVar14] & 1) != 0) {
LAB_0024a5eb:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pVVar8->pArray[lVar14] + 8);
      uVar11 = uVar6 & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        pAVar4 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Abc_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar11 + 0x28));
      }
      if (pNtk->vCos->nSize <= lVar14) {
LAB_0024a5ad:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar14],pAVar4);
      lVar14 = lVar14 + 1;
      pVVar8 = pMan->vCos;
    } while (lVar14 < pVVar8->nSize);
  }
  pAVar12 = pNtk;
  iVar13 = Abc_NtkCheck(pNtk);
  if (iVar13 == 0) {
    Abc_Print((int)pAVar12,"Abc_NtkAfterTrim(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAfterTrim( Aig_Man_t * pMan, Abc_Ntk_t * pNtkOld )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjOld;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
    assert( Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld) );
    assert( Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld) );
    assert( Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld) );
    assert( pMan->vCiNumsOrig != NULL );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, i) );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, i );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, Saig_ManPiNum(pMan)+i) );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName(pObjOld), NULL );
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, Saig_ManPoNum(pMan)+i );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName(pObjOld), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkAfterTrim(): Network check has failed.\n" );
    return pNtkNew;
}